

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

void initialize_testing(char *test_name)

{
  undefined8 *puVar1;
  long lVar2;
  long *in_FS_OFFSET;
  
  lVar2 = *in_FS_OFFSET;
  puVar1 = (undefined8 *)(lVar2 + -400);
  *puVar1 = 0;
  *(undefined8 **)(lVar2 + -0x180) = puVar1;
  *(undefined8 **)(lVar2 + -0x178) = puVar1;
  *(undefined4 *)(lVar2 + -0x188) = 1;
  initialize_source_location((SourceLocation *)(lVar2 + -0x170));
  puVar1 = (undefined8 *)(lVar2 + -0x140);
  *puVar1 = 0;
  *(undefined8 **)(lVar2 + -0x130) = puVar1;
  *(undefined8 **)(lVar2 + -0x128) = puVar1;
  *(undefined4 *)(lVar2 + -0x138) = 1;
  initialize_source_location((SourceLocation *)(lVar2 + -0x120));
  puVar1 = (undefined8 *)(lVar2 + -0x160);
  *puVar1 = 0;
  *(undefined8 **)(lVar2 + -0x150) = puVar1;
  *(undefined8 **)(lVar2 + -0x148) = puVar1;
  *(undefined4 *)(lVar2 + -0x158) = 1;
  initialize_source_location((SourceLocation *)(lVar2 + -0x120));
  return;
}

Assistant:

void initialize_testing(const char *test_name) {
    (void)test_name;
    list_initialize(&global_function_result_map_head);
    initialize_source_location(&global_last_mock_value_location);
    list_initialize(&global_function_parameter_map_head);
    initialize_source_location(&global_last_parameter_location);
    list_initialize(&global_call_ordering_head);
    initialize_source_location(&global_last_parameter_location);
}